

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distortion.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_15e5b2::DistortionState::update
          (DistortionState *this,ALCcontext *context,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  ALCdevice *pAVar1;
  pointer paVar2;
  MixParams *mix;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  array<float,_16UL> coeffs;
  array<float,_16UL> local_68;
  
  mix = target.Main;
  pAVar1 = (context->mDevice).mPtr;
  fVar3 = sinf((props->Reverb).Density * 1.5707964);
  fVar5 = 0.99;
  if (fVar3 <= 0.99) {
    fVar5 = fVar3;
  }
  this->mEdgeCoeff = (fVar5 + fVar5) / (1.0 - fVar5);
  fVar5 = (props->Reverb).Gain;
  fVar6 = (float)pAVar1->Frequency;
  fVar7 = (fVar5 / fVar6) * 0.25;
  fVar3 = fVar7 * 6.2831855;
  fVar4 = sinf(fVar3);
  fVar5 = sinhf((((fVar5 * 0.5) / (fVar5 * 0.67)) * 0.3465736 * fVar3) / fVar4);
  BiquadFilterR<float>::setParams(&this->mLowpass,LowPass,fVar7,1.0,fVar5 + fVar5);
  fVar5 = (props->Reverb).GainHF;
  fVar3 = (props->Reverb).DecayTime;
  fVar7 = (fVar5 / fVar6) * 0.25;
  fVar4 = fVar7 * 6.2831855;
  fVar6 = sinf(fVar4);
  fVar5 = sinhf(((fVar3 / (fVar5 * 0.67)) * 0.3465736 * fVar4) / fVar6);
  BiquadFilterR<float>::setParams(&this->mBandpass,BandPass,fVar7,1.0,fVar5 + fVar5);
  CalcAmbiCoeffs(&local_68,-0.0,0.0,1.0,0.0);
  paVar2 = (mix->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar2;
  ComputePanGains(mix,local_68._M_elems,slot->Gain * (props->Reverb).Diffusion,
                  (span<float,_16UL>)this->mGain);
  return;
}

Assistant:

void DistortionState::update(const ALCcontext *context, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    const ALCdevice *device{context->mDevice.get()};

    /* Store waveshaper edge settings. */
    const float edge{minf(std::sin(al::MathDefs<float>::Pi()*0.5f * props->Distortion.Edge),
        0.99f)};
    mEdgeCoeff = 2.0f * edge / (1.0f-edge);

    float cutoff{props->Distortion.LowpassCutoff};
    /* Bandwidth value is constant in octaves. */
    float bandwidth{(cutoff / 2.0f) / (cutoff * 0.67f)};
    /* Divide normalized frequency by the amount of oversampling done during
     * processing.
     */
    auto frequency = static_cast<float>(device->Frequency);
    mLowpass.setParamsFromBandwidth(BiquadType::LowPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    cutoff = props->Distortion.EQCenter;
    /* Convert bandwidth in Hz to octaves. */
    bandwidth = props->Distortion.EQBandwidth / (cutoff * 0.67f);
    mBandpass.setParamsFromBandwidth(BiquadType::BandPass, cutoff/frequency/4.0f, 1.0f, bandwidth);

    const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

    mOutTarget = target.Main->Buffer;
    ComputePanGains(target.Main, coeffs.data(), slot->Gain*props->Distortion.Gain, mGain);
}